

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall Am_Depends_Iterator::Next(Am_Depends_Iterator *this)

{
  Am_Dependency_Data *pAVar1;
  
  pAVar1 = this->current;
  if (pAVar1 != (Am_Dependency_Data *)0x0) goto LAB_001d01b7;
  if (this->context != (Am_Formula_Advanced *)0x0) {
    pAVar1 = (Am_Dependency_Data *)(this->context + 4);
    while( true ) {
      pAVar1 = *(Am_Dependency_Data **)pAVar1;
      this->current = pAVar1;
LAB_001d01c2:
      if ((pAVar1 == (Am_Dependency_Data *)0x0) || (*(long *)pAVar1 != 0)) break;
LAB_001d01b7:
      pAVar1 = pAVar1 + 0x10;
    }
    return;
  }
  pAVar1 = (Am_Dependency_Data *)0x0;
  goto LAB_001d01c2;
}

Assistant:

void
Am_Depends_Iterator::Next()
{
  if (current)
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
  else if (context)
    current = (Am_Dependency_Data *)((Formula_Constraint *)context)->depends_on;
  while (current && !(((Dependency *)current)->depended))
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
}